

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O1

void precomp_get_consttime(uint64_t *table,uint64_t bits_l,uint64_t *tmp)

{
  uint64_t uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint64_t *os;
  ulong uVar15;
  uint64_t *puVar16;
  uint64_t *puVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  
  puVar16 = table;
  puVar17 = tmp;
  for (lVar2 = 0xf; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar17 = *puVar16;
    puVar16 = puVar16 + 1;
    puVar17 = puVar17 + 1;
  }
  uVar1 = FStar_UInt64_eq_mask(bits_l,1);
  uVar15 = ~uVar1;
  uVar18 = *tmp & uVar15 | table[0xf] & uVar1;
  *tmp = uVar18;
  uVar19 = tmp[1] & uVar15 | table[0x10] & uVar1;
  tmp[1] = uVar19;
  uVar3 = tmp[2] & uVar15 | table[0x11] & uVar1;
  tmp[2] = uVar3;
  uVar4 = tmp[3] & uVar15 | table[0x12] & uVar1;
  tmp[3] = uVar4;
  uVar5 = tmp[4] & uVar15 | table[0x13] & uVar1;
  tmp[4] = uVar5;
  uVar6 = tmp[5] & uVar15 | table[0x14] & uVar1;
  tmp[5] = uVar6;
  uVar7 = tmp[6] & uVar15 | table[0x15] & uVar1;
  tmp[6] = uVar7;
  uVar8 = tmp[7] & uVar15 | table[0x16] & uVar1;
  tmp[7] = uVar8;
  uVar9 = tmp[8] & uVar15 | table[0x17] & uVar1;
  tmp[8] = uVar9;
  uVar10 = tmp[9] & uVar15 | table[0x18] & uVar1;
  tmp[9] = uVar10;
  uVar11 = tmp[10] & uVar15 | table[0x19] & uVar1;
  tmp[10] = uVar11;
  uVar12 = tmp[0xb] & uVar15 | table[0x1a] & uVar1;
  tmp[0xb] = uVar12;
  uVar13 = tmp[0xc] & uVar15 | table[0x1b] & uVar1;
  tmp[0xc] = uVar13;
  uVar14 = tmp[0xd] & uVar15 | table[0x1c] & uVar1;
  tmp[0xd] = uVar14;
  uVar15 = uVar15 & tmp[0xe] | uVar1 & table[0x1d];
  tmp[0xe] = uVar15;
  uVar1 = FStar_UInt64_eq_mask(bits_l,2);
  uVar22 = ~uVar1;
  uVar18 = uVar18 & uVar22 | table[0x1e] & uVar1;
  *tmp = uVar18;
  uVar20 = uVar19 & uVar22 | table[0x1f] & uVar1;
  tmp[1] = uVar20;
  uVar21 = uVar3 & uVar22 | table[0x20] & uVar1;
  tmp[2] = uVar21;
  uVar3 = uVar4 & uVar22 | table[0x21] & uVar1;
  tmp[3] = uVar3;
  uVar4 = uVar5 & uVar22 | table[0x22] & uVar1;
  tmp[4] = uVar4;
  uVar5 = uVar6 & uVar22 | table[0x23] & uVar1;
  tmp[5] = uVar5;
  uVar6 = uVar7 & uVar22 | table[0x24] & uVar1;
  tmp[6] = uVar6;
  uVar7 = uVar8 & uVar22 | table[0x25] & uVar1;
  tmp[7] = uVar7;
  uVar8 = uVar9 & uVar22 | table[0x26] & uVar1;
  tmp[8] = uVar8;
  uVar9 = uVar10 & uVar22 | table[0x27] & uVar1;
  tmp[9] = uVar9;
  uVar10 = uVar11 & uVar22 | table[0x28] & uVar1;
  tmp[10] = uVar10;
  uVar11 = uVar12 & uVar22 | table[0x29] & uVar1;
  tmp[0xb] = uVar11;
  uVar12 = uVar13 & uVar22 | table[0x2a] & uVar1;
  tmp[0xc] = uVar12;
  uVar13 = uVar14 & uVar22 | table[0x2b] & uVar1;
  tmp[0xd] = uVar13;
  uVar22 = uVar22 & uVar15 | uVar1 & table[0x2c];
  tmp[0xe] = uVar22;
  uVar1 = FStar_UInt64_eq_mask(bits_l,3);
  uVar19 = ~uVar1;
  uVar14 = uVar18 & uVar19 | table[0x2d] & uVar1;
  *tmp = uVar14;
  uVar15 = uVar20 & uVar19 | table[0x2e] & uVar1;
  tmp[1] = uVar15;
  uVar18 = uVar21 & uVar19 | table[0x2f] & uVar1;
  tmp[2] = uVar18;
  uVar3 = uVar3 & uVar19 | table[0x30] & uVar1;
  tmp[3] = uVar3;
  uVar20 = uVar4 & uVar19 | table[0x31] & uVar1;
  tmp[4] = uVar20;
  uVar4 = uVar5 & uVar19 | table[0x32] & uVar1;
  tmp[5] = uVar4;
  uVar21 = uVar6 & uVar19 | table[0x33] & uVar1;
  tmp[6] = uVar21;
  uVar5 = uVar7 & uVar19 | table[0x34] & uVar1;
  tmp[7] = uVar5;
  uVar6 = uVar8 & uVar19 | table[0x35] & uVar1;
  tmp[8] = uVar6;
  uVar7 = uVar9 & uVar19 | table[0x36] & uVar1;
  tmp[9] = uVar7;
  uVar8 = uVar10 & uVar19 | table[0x37] & uVar1;
  tmp[10] = uVar8;
  uVar9 = uVar11 & uVar19 | table[0x38] & uVar1;
  tmp[0xb] = uVar9;
  uVar10 = uVar12 & uVar19 | table[0x39] & uVar1;
  tmp[0xc] = uVar10;
  uVar11 = uVar13 & uVar19 | table[0x3a] & uVar1;
  tmp[0xd] = uVar11;
  uVar19 = uVar19 & uVar22 | uVar1 & table[0x3b];
  tmp[0xe] = uVar19;
  uVar1 = FStar_UInt64_eq_mask(bits_l,4);
  uVar22 = ~uVar1;
  uVar12 = uVar14 & uVar22 | table[0x3c] & uVar1;
  *tmp = uVar12;
  uVar13 = uVar15 & uVar22 | table[0x3d] & uVar1;
  tmp[1] = uVar13;
  uVar14 = uVar18 & uVar22 | table[0x3e] & uVar1;
  tmp[2] = uVar14;
  uVar3 = uVar3 & uVar22 | table[0x3f] & uVar1;
  tmp[3] = uVar3;
  uVar15 = uVar20 & uVar22 | table[0x40] & uVar1;
  tmp[4] = uVar15;
  uVar4 = uVar4 & uVar22 | table[0x41] & uVar1;
  tmp[5] = uVar4;
  uVar18 = uVar21 & uVar22 | table[0x42] & uVar1;
  tmp[6] = uVar18;
  uVar5 = uVar5 & uVar22 | table[0x43] & uVar1;
  tmp[7] = uVar5;
  uVar6 = uVar6 & uVar22 | table[0x44] & uVar1;
  tmp[8] = uVar6;
  uVar7 = uVar7 & uVar22 | table[0x45] & uVar1;
  tmp[9] = uVar7;
  uVar8 = uVar8 & uVar22 | table[0x46] & uVar1;
  tmp[10] = uVar8;
  uVar9 = uVar9 & uVar22 | table[0x47] & uVar1;
  tmp[0xb] = uVar9;
  uVar20 = uVar10 & uVar22 | table[0x48] & uVar1;
  tmp[0xc] = uVar20;
  uVar21 = uVar11 & uVar22 | table[0x49] & uVar1;
  tmp[0xd] = uVar21;
  uVar22 = uVar22 & uVar19 | uVar1 & table[0x4a];
  tmp[0xe] = uVar22;
  uVar1 = FStar_UInt64_eq_mask(bits_l,5);
  uVar19 = ~uVar1;
  uVar10 = uVar12 & uVar19 | table[0x4b] & uVar1;
  *tmp = uVar10;
  uVar11 = uVar13 & uVar19 | table[0x4c] & uVar1;
  tmp[1] = uVar11;
  uVar12 = uVar14 & uVar19 | table[0x4d] & uVar1;
  tmp[2] = uVar12;
  uVar3 = uVar3 & uVar19 | table[0x4e] & uVar1;
  tmp[3] = uVar3;
  uVar13 = uVar15 & uVar19 | table[0x4f] & uVar1;
  tmp[4] = uVar13;
  uVar4 = uVar4 & uVar19 | table[0x50] & uVar1;
  tmp[5] = uVar4;
  uVar14 = uVar18 & uVar19 | table[0x51] & uVar1;
  tmp[6] = uVar14;
  uVar5 = uVar5 & uVar19 | table[0x52] & uVar1;
  tmp[7] = uVar5;
  uVar6 = uVar6 & uVar19 | table[0x53] & uVar1;
  tmp[8] = uVar6;
  uVar7 = uVar7 & uVar19 | table[0x54] & uVar1;
  tmp[9] = uVar7;
  uVar8 = uVar8 & uVar19 | table[0x55] & uVar1;
  tmp[10] = uVar8;
  uVar9 = uVar9 & uVar19 | table[0x56] & uVar1;
  tmp[0xb] = uVar9;
  uVar18 = uVar20 & uVar19 | table[0x57] & uVar1;
  tmp[0xc] = uVar18;
  uVar20 = uVar21 & uVar19 | table[0x58] & uVar1;
  tmp[0xd] = uVar20;
  uVar15 = uVar19 & uVar22 | uVar1 & table[0x59];
  tmp[0xe] = uVar15;
  uVar1 = FStar_UInt64_eq_mask(bits_l,6);
  uVar21 = ~uVar1;
  uVar10 = uVar10 & uVar21 | table[0x5a] & uVar1;
  *tmp = uVar10;
  uVar11 = uVar11 & uVar21 | table[0x5b] & uVar1;
  tmp[1] = uVar11;
  uVar12 = uVar12 & uVar21 | table[0x5c] & uVar1;
  tmp[2] = uVar12;
  uVar3 = uVar3 & uVar21 | table[0x5d] & uVar1;
  tmp[3] = uVar3;
  uVar13 = uVar13 & uVar21 | table[0x5e] & uVar1;
  tmp[4] = uVar13;
  uVar4 = uVar4 & uVar21 | table[0x5f] & uVar1;
  tmp[5] = uVar4;
  uVar14 = uVar14 & uVar21 | table[0x60] & uVar1;
  tmp[6] = uVar14;
  uVar5 = uVar5 & uVar21 | table[0x61] & uVar1;
  tmp[7] = uVar5;
  uVar6 = uVar6 & uVar21 | table[0x62] & uVar1;
  tmp[8] = uVar6;
  uVar7 = uVar7 & uVar21 | table[99] & uVar1;
  tmp[9] = uVar7;
  uVar8 = uVar8 & uVar21 | table[100] & uVar1;
  tmp[10] = uVar8;
  uVar9 = uVar9 & uVar21 | table[0x65] & uVar1;
  tmp[0xb] = uVar9;
  uVar18 = uVar18 & uVar21 | table[0x66] & uVar1;
  tmp[0xc] = uVar18;
  uVar19 = uVar20 & uVar21 | table[0x67] & uVar1;
  tmp[0xd] = uVar19;
  uVar20 = uVar21 & uVar15 | uVar1 & table[0x68];
  tmp[0xe] = uVar20;
  uVar1 = FStar_UInt64_eq_mask(bits_l,7);
  uVar15 = ~uVar1;
  uVar10 = uVar10 & uVar15 | table[0x69] & uVar1;
  *tmp = uVar10;
  uVar11 = uVar11 & uVar15 | table[0x6a] & uVar1;
  tmp[1] = uVar11;
  uVar12 = uVar12 & uVar15 | table[0x6b] & uVar1;
  tmp[2] = uVar12;
  uVar3 = uVar3 & uVar15 | table[0x6c] & uVar1;
  tmp[3] = uVar3;
  uVar13 = uVar13 & uVar15 | table[0x6d] & uVar1;
  tmp[4] = uVar13;
  uVar4 = uVar4 & uVar15 | table[0x6e] & uVar1;
  tmp[5] = uVar4;
  uVar14 = uVar14 & uVar15 | table[0x6f] & uVar1;
  tmp[6] = uVar14;
  uVar5 = uVar5 & uVar15 | table[0x70] & uVar1;
  tmp[7] = uVar5;
  uVar6 = uVar6 & uVar15 | table[0x71] & uVar1;
  tmp[8] = uVar6;
  uVar7 = uVar7 & uVar15 | table[0x72] & uVar1;
  tmp[9] = uVar7;
  uVar8 = uVar8 & uVar15 | table[0x73] & uVar1;
  tmp[10] = uVar8;
  uVar9 = uVar9 & uVar15 | table[0x74] & uVar1;
  tmp[0xb] = uVar9;
  uVar18 = uVar18 & uVar15 | table[0x75] & uVar1;
  tmp[0xc] = uVar18;
  uVar19 = uVar19 & uVar15 | table[0x76] & uVar1;
  tmp[0xd] = uVar19;
  uVar15 = uVar15 & uVar20 | uVar1 & table[0x77];
  tmp[0xe] = uVar15;
  uVar1 = FStar_UInt64_eq_mask(bits_l,8);
  uVar20 = ~uVar1;
  uVar10 = uVar10 & uVar20 | table[0x78] & uVar1;
  *tmp = uVar10;
  uVar11 = uVar11 & uVar20 | table[0x79] & uVar1;
  tmp[1] = uVar11;
  uVar12 = uVar12 & uVar20 | table[0x7a] & uVar1;
  tmp[2] = uVar12;
  uVar3 = uVar3 & uVar20 | table[0x7b] & uVar1;
  tmp[3] = uVar3;
  uVar13 = uVar13 & uVar20 | table[0x7c] & uVar1;
  tmp[4] = uVar13;
  uVar4 = uVar4 & uVar20 | table[0x7d] & uVar1;
  tmp[5] = uVar4;
  uVar14 = uVar14 & uVar20 | table[0x7e] & uVar1;
  tmp[6] = uVar14;
  uVar5 = uVar5 & uVar20 | table[0x7f] & uVar1;
  tmp[7] = uVar5;
  uVar6 = uVar6 & uVar20 | table[0x80] & uVar1;
  tmp[8] = uVar6;
  uVar7 = uVar7 & uVar20 | table[0x81] & uVar1;
  tmp[9] = uVar7;
  uVar8 = uVar8 & uVar20 | table[0x82] & uVar1;
  tmp[10] = uVar8;
  uVar9 = uVar9 & uVar20 | table[0x83] & uVar1;
  tmp[0xb] = uVar9;
  uVar18 = uVar18 & uVar20 | table[0x84] & uVar1;
  tmp[0xc] = uVar18;
  uVar19 = uVar19 & uVar20 | table[0x85] & uVar1;
  tmp[0xd] = uVar19;
  uVar20 = uVar20 & uVar15 | uVar1 & table[0x86];
  tmp[0xe] = uVar20;
  uVar1 = FStar_UInt64_eq_mask(bits_l,9);
  uVar15 = ~uVar1;
  uVar10 = uVar10 & uVar15 | table[0x87] & uVar1;
  *tmp = uVar10;
  uVar11 = uVar11 & uVar15 | table[0x88] & uVar1;
  tmp[1] = uVar11;
  uVar12 = uVar12 & uVar15 | table[0x89] & uVar1;
  tmp[2] = uVar12;
  uVar3 = uVar3 & uVar15 | table[0x8a] & uVar1;
  tmp[3] = uVar3;
  uVar13 = uVar13 & uVar15 | table[0x8b] & uVar1;
  tmp[4] = uVar13;
  uVar4 = uVar4 & uVar15 | table[0x8c] & uVar1;
  tmp[5] = uVar4;
  uVar14 = uVar14 & uVar15 | table[0x8d] & uVar1;
  tmp[6] = uVar14;
  uVar5 = uVar5 & uVar15 | table[0x8e] & uVar1;
  tmp[7] = uVar5;
  uVar6 = uVar6 & uVar15 | table[0x8f] & uVar1;
  tmp[8] = uVar6;
  uVar7 = uVar7 & uVar15 | table[0x90] & uVar1;
  tmp[9] = uVar7;
  uVar8 = uVar8 & uVar15 | table[0x91] & uVar1;
  tmp[10] = uVar8;
  uVar9 = uVar9 & uVar15 | table[0x92] & uVar1;
  tmp[0xb] = uVar9;
  uVar18 = uVar18 & uVar15 | table[0x93] & uVar1;
  tmp[0xc] = uVar18;
  uVar19 = uVar19 & uVar15 | table[0x94] & uVar1;
  tmp[0xd] = uVar19;
  uVar15 = uVar15 & uVar20 | uVar1 & table[0x95];
  tmp[0xe] = uVar15;
  uVar1 = FStar_UInt64_eq_mask(bits_l,10);
  uVar20 = ~uVar1;
  uVar10 = uVar10 & uVar20 | table[0x96] & uVar1;
  *tmp = uVar10;
  uVar11 = uVar11 & uVar20 | table[0x97] & uVar1;
  tmp[1] = uVar11;
  uVar12 = uVar12 & uVar20 | table[0x98] & uVar1;
  tmp[2] = uVar12;
  uVar3 = uVar3 & uVar20 | table[0x99] & uVar1;
  tmp[3] = uVar3;
  uVar13 = uVar13 & uVar20 | table[0x9a] & uVar1;
  tmp[4] = uVar13;
  uVar4 = uVar4 & uVar20 | table[0x9b] & uVar1;
  tmp[5] = uVar4;
  uVar14 = uVar14 & uVar20 | table[0x9c] & uVar1;
  tmp[6] = uVar14;
  uVar5 = uVar5 & uVar20 | table[0x9d] & uVar1;
  tmp[7] = uVar5;
  uVar6 = uVar6 & uVar20 | table[0x9e] & uVar1;
  tmp[8] = uVar6;
  uVar7 = uVar7 & uVar20 | table[0x9f] & uVar1;
  tmp[9] = uVar7;
  uVar8 = uVar8 & uVar20 | table[0xa0] & uVar1;
  tmp[10] = uVar8;
  uVar9 = uVar9 & uVar20 | table[0xa1] & uVar1;
  tmp[0xb] = uVar9;
  uVar18 = uVar18 & uVar20 | table[0xa2] & uVar1;
  tmp[0xc] = uVar18;
  uVar19 = uVar19 & uVar20 | table[0xa3] & uVar1;
  tmp[0xd] = uVar19;
  uVar20 = uVar20 & uVar15 | uVar1 & table[0xa4];
  tmp[0xe] = uVar20;
  uVar1 = FStar_UInt64_eq_mask(bits_l,0xb);
  uVar15 = ~uVar1;
  uVar10 = uVar10 & uVar15 | table[0xa5] & uVar1;
  *tmp = uVar10;
  uVar11 = uVar11 & uVar15 | table[0xa6] & uVar1;
  tmp[1] = uVar11;
  uVar12 = uVar12 & uVar15 | table[0xa7] & uVar1;
  tmp[2] = uVar12;
  uVar3 = uVar3 & uVar15 | table[0xa8] & uVar1;
  tmp[3] = uVar3;
  uVar13 = uVar13 & uVar15 | table[0xa9] & uVar1;
  tmp[4] = uVar13;
  uVar4 = uVar4 & uVar15 | table[0xaa] & uVar1;
  tmp[5] = uVar4;
  uVar14 = uVar14 & uVar15 | table[0xab] & uVar1;
  tmp[6] = uVar14;
  uVar5 = uVar5 & uVar15 | table[0xac] & uVar1;
  tmp[7] = uVar5;
  uVar6 = uVar6 & uVar15 | table[0xad] & uVar1;
  tmp[8] = uVar6;
  uVar7 = uVar7 & uVar15 | table[0xae] & uVar1;
  tmp[9] = uVar7;
  uVar8 = uVar8 & uVar15 | table[0xaf] & uVar1;
  tmp[10] = uVar8;
  uVar9 = uVar9 & uVar15 | table[0xb0] & uVar1;
  tmp[0xb] = uVar9;
  uVar18 = uVar18 & uVar15 | table[0xb1] & uVar1;
  tmp[0xc] = uVar18;
  uVar19 = uVar19 & uVar15 | table[0xb2] & uVar1;
  tmp[0xd] = uVar19;
  uVar15 = uVar15 & uVar20 | uVar1 & table[0xb3];
  tmp[0xe] = uVar15;
  uVar1 = FStar_UInt64_eq_mask(bits_l,0xc);
  uVar21 = ~uVar1;
  uVar10 = uVar10 & uVar21 | table[0xb4] & uVar1;
  *tmp = uVar10;
  uVar11 = uVar11 & uVar21 | table[0xb5] & uVar1;
  tmp[1] = uVar11;
  uVar12 = uVar12 & uVar21 | table[0xb6] & uVar1;
  tmp[2] = uVar12;
  uVar3 = uVar3 & uVar21 | table[0xb7] & uVar1;
  tmp[3] = uVar3;
  uVar13 = uVar13 & uVar21 | table[0xb8] & uVar1;
  tmp[4] = uVar13;
  uVar4 = uVar4 & uVar21 | table[0xb9] & uVar1;
  tmp[5] = uVar4;
  uVar14 = uVar14 & uVar21 | table[0xba] & uVar1;
  tmp[6] = uVar14;
  uVar5 = uVar5 & uVar21 | table[0xbb] & uVar1;
  tmp[7] = uVar5;
  uVar6 = uVar6 & uVar21 | table[0xbc] & uVar1;
  tmp[8] = uVar6;
  uVar7 = uVar7 & uVar21 | table[0xbd] & uVar1;
  tmp[9] = uVar7;
  uVar8 = uVar8 & uVar21 | table[0xbe] & uVar1;
  tmp[10] = uVar8;
  uVar9 = uVar9 & uVar21 | table[0xbf] & uVar1;
  tmp[0xb] = uVar9;
  uVar18 = uVar18 & uVar21 | table[0xc0] & uVar1;
  tmp[0xc] = uVar18;
  uVar20 = uVar19 & uVar21 | table[0xc1] & uVar1;
  tmp[0xd] = uVar20;
  uVar21 = uVar21 & uVar15 | uVar1 & table[0xc2];
  tmp[0xe] = uVar21;
  uVar1 = FStar_UInt64_eq_mask(bits_l,0xd);
  uVar15 = ~uVar1;
  uVar10 = uVar10 & uVar15 | table[0xc3] & uVar1;
  *tmp = uVar10;
  uVar11 = uVar11 & uVar15 | table[0xc4] & uVar1;
  tmp[1] = uVar11;
  uVar12 = uVar12 & uVar15 | table[0xc5] & uVar1;
  tmp[2] = uVar12;
  uVar3 = uVar3 & uVar15 | table[0xc6] & uVar1;
  tmp[3] = uVar3;
  uVar13 = uVar13 & uVar15 | table[199] & uVar1;
  tmp[4] = uVar13;
  uVar4 = uVar4 & uVar15 | table[200] & uVar1;
  tmp[5] = uVar4;
  uVar14 = uVar14 & uVar15 | table[0xc9] & uVar1;
  tmp[6] = uVar14;
  uVar5 = uVar5 & uVar15 | table[0xca] & uVar1;
  tmp[7] = uVar5;
  uVar6 = uVar6 & uVar15 | table[0xcb] & uVar1;
  tmp[8] = uVar6;
  uVar7 = uVar7 & uVar15 | table[0xcc] & uVar1;
  tmp[9] = uVar7;
  uVar8 = uVar8 & uVar15 | table[0xcd] & uVar1;
  tmp[10] = uVar8;
  uVar9 = uVar9 & uVar15 | table[0xce] & uVar1;
  tmp[0xb] = uVar9;
  uVar19 = uVar18 & uVar15 | table[0xcf] & uVar1;
  tmp[0xc] = uVar19;
  uVar20 = uVar20 & uVar15 | table[0xd0] & uVar1;
  tmp[0xd] = uVar20;
  uVar18 = uVar15 & uVar21 | uVar1 & table[0xd1];
  tmp[0xe] = uVar18;
  uVar1 = FStar_UInt64_eq_mask(bits_l,0xe);
  uVar21 = ~uVar1;
  uVar10 = uVar10 & uVar21 | table[0xd2] & uVar1;
  *tmp = uVar10;
  uVar11 = uVar11 & uVar21 | table[0xd3] & uVar1;
  tmp[1] = uVar11;
  uVar12 = uVar12 & uVar21 | table[0xd4] & uVar1;
  tmp[2] = uVar12;
  uVar15 = uVar3 & uVar21 | table[0xd5] & uVar1;
  tmp[3] = uVar15;
  uVar13 = uVar13 & uVar21 | table[0xd6] & uVar1;
  tmp[4] = uVar13;
  uVar4 = uVar4 & uVar21 | table[0xd7] & uVar1;
  tmp[5] = uVar4;
  uVar14 = uVar14 & uVar21 | table[0xd8] & uVar1;
  tmp[6] = uVar14;
  uVar5 = uVar5 & uVar21 | table[0xd9] & uVar1;
  tmp[7] = uVar5;
  uVar6 = uVar6 & uVar21 | table[0xda] & uVar1;
  tmp[8] = uVar6;
  uVar7 = uVar7 & uVar21 | table[0xdb] & uVar1;
  tmp[9] = uVar7;
  uVar8 = uVar8 & uVar21 | table[0xdc] & uVar1;
  tmp[10] = uVar8;
  uVar9 = uVar9 & uVar21 | table[0xdd] & uVar1;
  tmp[0xb] = uVar9;
  uVar19 = uVar19 & uVar21 | table[0xde] & uVar1;
  tmp[0xc] = uVar19;
  uVar20 = uVar20 & uVar21 | table[0xdf] & uVar1;
  tmp[0xd] = uVar20;
  uVar18 = uVar21 & uVar18 | uVar1 & table[0xe0];
  tmp[0xe] = uVar18;
  uVar1 = FStar_UInt64_eq_mask(bits_l,0xf);
  uVar3 = ~uVar1;
  *tmp = uVar10 & uVar3 | table[0xe1] & uVar1;
  tmp[1] = uVar11 & uVar3 | table[0xe2] & uVar1;
  tmp[2] = uVar12 & uVar3 | table[0xe3] & uVar1;
  tmp[3] = uVar15 & uVar3 | table[0xe4] & uVar1;
  tmp[4] = uVar13 & uVar3 | table[0xe5] & uVar1;
  tmp[5] = uVar4 & uVar3 | table[0xe6] & uVar1;
  tmp[6] = uVar14 & uVar3 | table[0xe7] & uVar1;
  tmp[7] = uVar5 & uVar3 | table[0xe8] & uVar1;
  tmp[8] = uVar6 & uVar3 | table[0xe9] & uVar1;
  tmp[9] = uVar7 & uVar3 | table[0xea] & uVar1;
  tmp[10] = uVar8 & uVar3 | table[0xeb] & uVar1;
  tmp[0xb] = uVar9 & uVar3 | table[0xec] & uVar1;
  tmp[0xc] = uVar19 & uVar3 | table[0xed] & uVar1;
  tmp[0xd] = uVar20 & uVar3 | table[0xee] & uVar1;
  tmp[0xe] = uVar3 & uVar18 | uVar1 & table[0xef];
  return;
}

Assistant:

static inline void precomp_get_consttime(const uint64_t *table, uint64_t bits_l, uint64_t *tmp)
{
  memcpy(tmp, (uint64_t *)table, 12U * sizeof (uint64_t));
  KRML_MAYBE_FOR15(i0,
    0U,
    15U,
    1U,
    uint64_t c = FStar_UInt64_eq_mask(bits_l, (uint64_t)(i0 + 1U));
    const uint64_t *res_j = table + (i0 + 1U) * 12U;
    KRML_MAYBE_FOR12(i,
      0U,
      12U,
      1U,
      uint64_t *os = tmp;
      uint64_t x = (c & res_j[i]) | (~c & tmp[i]);
      os[i] = x;););
}